

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardDemodulation.cpp
# Opt level: O2

void __thiscall
Inferences::ForwardDemodulation::attach(ForwardDemodulation *this,SaturationAlgorithm *salg)

{
  int iVar1;
  DemodulationLHSIndex *pDVar2;
  undefined4 extraout_var;
  DemodulationHelper local_20;
  Options *opts;
  
  (this->super_ForwardSimplificationEngine).super_InferenceEngine._salg = salg;
  pDVar2 = (DemodulationLHSIndex *)
           Indexing::IndexManager::request((salg->_imgr)._obj,DEMODULATION_LHS_CODE_TREE);
  this->_index = pDVar2;
  iVar1 = (*(this->super_ForwardSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine[4]
          )(this);
  opts = (Options *)CONCAT44(extraout_var,iVar1);
  this->_preorderedOnly =
       (opts->_forwardDemodulation).super_OptionValue<Shell::Options::Demodulation>.actualValue ==
       PREORDERED;
  this->_encompassing =
       (opts->_demodulationRedundancyCheck).
       super_OptionValue<Shell::Options::DemodulationRedundancyCheck>.actualValue == ENCOMPASS;
  this->_useTermOrderingDiagrams =
       (bool)(opts->_forwardDemodulationTermOrderingDiagrams).super_OptionValue<bool>.
             super_AbstractOptionValue.field_0x92;
  this->_skipNonequationalLiterals =
       (bool)(opts->_demodulationOnlyEquational).super_OptionValue<bool>.super_AbstractOptionValue.
             field_0x92;
  DemodulationHelper::DemodulationHelper
            (&local_20,opts,
             (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering).
             _obj);
  (this->_helper)._redundancyCheck = local_20._redundancyCheck;
  (this->_helper)._encompassing = local_20._encompassing;
  *(undefined6 *)&(this->_helper).field_0x2 = local_20._2_6_;
  (this->_helper)._ord = local_20._ord;
  return;
}

Assistant:

void ForwardDemodulation::attach(SaturationAlgorithm* salg)
{
  ForwardSimplificationEngine::attach(salg);
  _index=static_cast<DemodulationLHSIndex*>(
	  _salg->getIndexManager()->request(DEMODULATION_LHS_CODE_TREE) );

  auto& opt = getOptions();
  _preorderedOnly = opt.forwardDemodulation()==Options::Demodulation::PREORDERED;
  _encompassing = opt.demodulationRedundancyCheck()==Options::DemodulationRedundancyCheck::ENCOMPASS;
  _useTermOrderingDiagrams = opt.forwardDemodulationTermOrderingDiagrams();
  _skipNonequationalLiterals = opt.demodulationOnlyEquational();
  _helper = DemodulationHelper(opt, &_salg->getOrdering());
}